

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsBody.cpp
# Opt level: O1

void __thiscall
chrono::ChShaftsBodyTranslation::ChShaftsBodyTranslation
          (ChShaftsBodyTranslation *this,ChShaftsBodyTranslation *other)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [64];
  
  ChPhysicsItem::ChPhysicsItem(&this->super_ChPhysicsItem,&other->super_ChPhysicsItem);
  (this->super_ChPhysicsItem).super_ChObj._vptr_ChObj =
       (_func_int **)&PTR__ChShaftsBodyTranslation_00b4be88;
  auVar1 = ZEXT1632(ZEXT816(0) << 0x40);
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.c_i = (double)auVar1._0_8_;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.l_i = (double)auVar1._8_8_;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.b_i = (double)auVar1._16_8_;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.cfm_i = (double)auVar1._24_8_;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.valid = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.disabled = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.redundant = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.broken = false;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.active = true;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.mode = CONSTRAINT_LOCK;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint.g_i = 0.0;
  (this->constraint).super_ChConstraintTwo.variables_a = (ChVariables *)0x0;
  (this->constraint).super_ChConstraintTwo.variables_b = (ChVariables *)0x0;
  (this->constraint).super_ChConstraintTwo.super_ChConstraint._vptr_ChConstraint =
       (_func_int **)&PTR__ChConstraintTwoGeneric_00b62c70;
  auVar2 = ZEXT464(0) << 0x40;
  (this->constraint).Cq_a = (ChRowVectorDynamic<double>)auVar2._0_16_;
  (this->constraint).Cq_b = (ChRowVectorDynamic<double>)auVar2._16_16_;
  (this->constraint).Eq_a = (ChVectorDynamic<double>)auVar2._32_16_;
  (this->constraint).Eq_b = (ChVectorDynamic<double>)auVar2._48_16_;
  this->shaft_dir = (ChVector<double>)auVar1._0_24_;
  (this->shaft_pos).m_data[0] = (double)auVar1._24_8_;
  *(undefined1 (*) [32])((this->shaft_dir).m_data + 2) = ZEXT1632(ZEXT816(0) << 0x40);
  this->force_react = other->force_react;
  if (other != this) {
    (this->shaft_dir).m_data[0] = (other->shaft_dir).m_data[0];
    (this->shaft_dir).m_data[1] = (other->shaft_dir).m_data[1];
    (this->shaft_dir).m_data[2] = (other->shaft_dir).m_data[2];
    (this->shaft_pos).m_data[0] = (other->shaft_pos).m_data[0];
    (this->shaft_pos).m_data[1] = (other->shaft_pos).m_data[1];
    (this->shaft_pos).m_data[2] = (other->shaft_pos).m_data[2];
  }
  this->shaft = (ChShaft *)0x0;
  this->body = (ChBodyFrame *)0x0;
  return;
}

Assistant:

ChShaftsBodyTranslation::ChShaftsBodyTranslation(const ChShaftsBodyTranslation& other) : ChPhysicsItem(other) {
    force_react = other.force_react;
    shaft_dir = other.shaft_dir;
    shaft_pos = other.shaft_pos;
    shaft = NULL;
    body = NULL;
}